

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_clone.c
# Opt level: O2

mpt_node * mpt_list_clone(mpt_node *src)

{
  mpt_node *pmVar1;
  mpt_node *insert;
  mpt_node *pmVar2;
  mpt_node *pmVar3;
  mpt_node *curr;
  
  curr = (mpt_node *)0x0;
  pmVar3 = (mpt_node *)0x0;
  while( true ) {
    if (src == (mpt_node *)0x0) {
      return curr;
    }
    insert = mpt_node_clone(src);
    if (insert == (mpt_node *)0x0) break;
    pmVar1 = insert;
    pmVar2 = insert;
    if (pmVar3 != (mpt_node *)0x0) {
      pmVar2 = mpt_gnode_after(pmVar3,insert);
      pmVar1 = curr;
    }
    curr = pmVar1;
    if (src->children != (mpt_node *)0x0) {
      pmVar3 = mpt_list_clone(src->children);
      insert->children = pmVar3;
      if (pmVar3 != (mpt_node *)0x0) break;
    }
    src = src->next;
    pmVar3 = pmVar2;
  }
  while (curr != (mpt_node *)0x0) {
    pmVar3 = curr->next;
    mpt_node_unlink(curr);
    mpt_node_destroy(curr);
    curr = pmVar3;
  }
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_list_clone(const MPT_STRUCT(node) *src)
{
	MPT_STRUCT(node) *first = 0, *last = 0;
	
	for (; src; src = src->next) {
		MPT_STRUCT(node) *cpy;
		
		if ((cpy = mpt_node_clone(src))) {
			if (!last) {
				last = first = cpy;
			} else {
				last = mpt_gnode_after(last, cpy);
			}
			/* require empty or cloned subtree */
			if (!src->children
			    || !(cpy->children = mpt_list_clone(src->children))) {
				continue;
			}
		}
		for (cpy = first; cpy; cpy = first) {
			first = first->next;
			mpt_node_unlink(cpy);
			mpt_node_destroy(cpy);
		}
		return 0;
	}
	return first;
}